

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

void __thiscall Json::Value::clear(Value *this)

{
  byte bVar1;
  undefined8 extraout_RAX;
  ostringstream oss;
  string local_1a0;
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  bVar1 = (byte)*(ushort *)&this->field_0x8;
  if ((1 < bVar1 - 6) && (bVar1 != 0)) {
    std::__cxx11::ostringstream::ostringstream(local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_180,"in Json::Value::clear(): requires complex value",0x2f);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream(local_180);
    std::ios_base::~ios_base(local_110);
    _Unwind_Resume(extraout_RAX);
  }
  this->start_ = 0;
  this->limit_ = 0;
  if ((*(ushort *)&this->field_0x8 & 0xfe) == 6) {
    std::
    _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
    ::clear(&((this->value_).map_)->_M_t);
    return;
  }
  return;
}

Assistant:

void Value::clear() {
  JSON_ASSERT_MESSAGE(type_ == nullValue || type_ == arrayValue ||
                          type_ == objectValue,
                      "in Json::Value::clear(): requires complex value");
  start_ = 0;
  limit_ = 0;
  switch (type_) {
  case arrayValue:
  case objectValue:
    value_.map_->clear();
    break;
  default:
    break;
  }
}